

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateEmbeddingNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  undefined1 *puVar4;
  undefined1 *weights;
  Result *_result;
  string local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (this->ndArrayInterpretation == true) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EmbeddingND","");
            validateInputOutputRankEquality
                      (__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"EmbeddingND","");
            validateRankCount(__return_storage_ptr__,layer,&local_70,2,5,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar3) {
              return __return_storage_ptr__;
            }
          }
          if (layer->_oneof_case_[0] == 0x410) {
            puVar4 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar4 = Specification::_EmbeddingNDLayerParams_default_instance_;
          }
          weights = (undefined1 *)(((ActivationParams *)puVar4)->NonlinearityType_).linear_;
          if ((WeightParams *)weights == (WeightParams *)0x0) {
            weights = Specification::_WeightParams_default_instance_;
          }
          puVar4 = (undefined1 *)((InnerProductLayerParams *)puVar4)->bias_;
          if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
            puVar4 = Specification::_WeightParams_default_instance_;
          }
          validateEmbeddingWeightsBias
                    (__return_storage_ptr__,layer,(WeightParams *)weights,(WeightParams *)puVar4);
          bVar3 = Result::good(__return_storage_ptr__);
          if (bVar3) {
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateEmbeddingNDLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "EmbeddingND", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "EmbeddingND", 2, 5, blobNameToRank));
    }

    const auto& params = layer.embeddingnd();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateEmbeddingWeightsBias(layer, params.weights(), params.bias()));

    return Result();
}